

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

AffineSpace3fa * __thiscall
embree::XMLLoader::load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
          (AffineSpace3fa *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  Token *this_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  bool bVar6;
  runtime_error *this_01;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 extraout_XMM0_Dd;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  float fVar17;
  float fVar18;
  float fVar23;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  float fVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  string sStack_218;
  Vec3f v;
  ulong uStack_1d0;
  allocator local_1bb;
  allocator local_1ba;
  allocator local_1b9;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  Vec3f p;
  string local_158;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  string local_128;
  string local_108;
  float local_e8;
  float local_d8;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  undefined1 auVar20 [16];
  
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)&v,"translate",(allocator *)&p);
  XML::parm(&sStack_218,pXVar1,(string *)&v);
  bVar6 = std::operator!=(&sStack_218,"");
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::string::~string((string *)&v);
  if (bVar6) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&sStack_218,"translate",(allocator *)&p);
    XML::parm(&local_40,pXVar1,&sStack_218);
    string_to_Vec3f((embree *)&v,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&sStack_218);
    aVar13.m128[1] = v.field_0.field_0.y;
    aVar13.m128[0] = v.field_0.field_0.x;
    aVar13.m128[2] = v.field_0.field_0.z;
    aVar13.m128[3] = 0.0;
    aVar9._0_12_ = ZEXT812(0x3f800000);
    aVar9.m128[3] = 0.0;
    (__return_storage_ptr__->l).vx.field_0 = aVar9;
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = 0x3f80000000000000;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = 0x3f800000;
    (__return_storage_ptr__->p).field_0 = aVar13;
    return __return_storage_ptr__;
  }
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)&v,"scale",(allocator *)&p);
  XML::parm(&sStack_218,pXVar1,(string *)&v);
  bVar6 = std::operator!=(&sStack_218,"");
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::string::~string((string *)&v);
  if (bVar6) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&sStack_218,"scale",(allocator *)&p);
    XML::parm(&local_60,pXVar1,&sStack_218);
    string_to_Vec3f((embree *)&v,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&sStack_218);
    aVar25._0_12_ = ZEXT812(0);
    aVar25.m128[3] = 0.0;
    (__return_storage_ptr__->l).vx.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT416((uint)v.field_0.field_0.x);
    (__return_storage_ptr__->l).vy.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)(ZEXT416((uint)v.field_0.field_0.y) << 0x20);
    (__return_storage_ptr__->l).vz.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)(ZEXT416((uint)v.field_0.field_0.z) << 0x40);
    (__return_storage_ptr__->p).field_0 = aVar25;
    return __return_storage_ptr__;
  }
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)&v,"rotate_x",(allocator *)&p);
  XML::parm(&sStack_218,pXVar1,(string *)&v);
  bVar6 = std::operator!=(&sStack_218,"");
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::string::~string((string *)&v);
  if (bVar6) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&v,"rotate_x",(allocator *)&p);
    XML::parm(&sStack_218,pXVar1,(string *)&v);
    fVar7 = std::__cxx11::stof(&sStack_218,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&sStack_218);
    std::__cxx11::string::~string((string *)&v);
    auVar10._0_12_ = ZEXT812(0x3f800000);
    auVar10._12_4_ = 0;
    auVar11 = rsqrtss(auVar10,auVar10);
    fVar8 = auVar11._0_4_;
    fVar8 = fVar8 * fVar8 * fVar8 * -0.5 + fVar8 * 1.5;
    local_1b8._4_4_ = fVar8 * 0.0;
    local_1b8._0_4_ = fVar8 * 1.0;
    uStack_1b0._0_4_ = fVar8 * 0.0;
    uStack_1b0._4_4_ = fVar8 * 0.0;
  }
  else {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&v,"rotate_y",(allocator *)&p);
    XML::parm(&sStack_218,pXVar1,(string *)&v);
    bVar6 = std::operator!=(&sStack_218,"");
    std::__cxx11::string::~string((string *)&sStack_218);
    std::__cxx11::string::~string((string *)&v);
    if (bVar6) {
      pXVar1 = xml->ptr;
      std::__cxx11::string::string((string *)&v,"rotate_y",(allocator *)&p);
      XML::parm(&sStack_218,pXVar1,(string *)&v);
      fVar7 = std::__cxx11::stof(&sStack_218,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&sStack_218);
      std::__cxx11::string::~string((string *)&v);
      auVar11._0_12_ = ZEXT812(0x3f800000);
      auVar11._12_4_ = 0;
      auVar11 = rsqrtss(auVar11,auVar11);
      fVar8 = auVar11._0_4_;
      fVar8 = fVar8 * fVar8 * fVar8 * -0.5 + fVar8 * 1.5;
      local_1b8._4_4_ = fVar8 * 1.0;
      uStack_1b0._0_4_ = fVar8 * 0.0;
    }
    else {
      pXVar1 = xml->ptr;
      std::__cxx11::string::string((string *)&v,"rotate_z",(allocator *)&p);
      XML::parm(&sStack_218,pXVar1,(string *)&v);
      bVar6 = std::operator!=(&sStack_218,"");
      std::__cxx11::string::~string((string *)&sStack_218);
      std::__cxx11::string::~string((string *)&v);
      if (!bVar6) {
        pXVar1 = xml->ptr;
        std::__cxx11::string::string((string *)&v,"angle",&local_1b9);
        XML::parm(&sStack_218,pXVar1,(string *)&v);
        bVar6 = std::operator!=(&sStack_218,"");
        if (bVar6) {
          pXVar1 = xml->ptr;
          std::__cxx11::string::string((string *)&local_158,"axis",&local_1ba);
          XML::parm((string *)&p,pXVar1,&local_158);
          bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p,"");
          if (!bVar6) {
            std::__cxx11::string::~string((string *)&p);
            std::__cxx11::string::~string((string *)&local_158);
            goto LAB_0016aaf0;
          }
          pXVar1 = xml->ptr;
          std::__cxx11::string::string((string *)&local_128,"point",&local_1bb);
          XML::parm(&local_108,pXVar1,&local_128);
          bVar6 = std::operator!=(&local_108,"");
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&p);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&sStack_218);
          std::__cxx11::string::~string((string *)&v);
          if (bVar6) {
            pXVar1 = xml->ptr;
            std::__cxx11::string::string((string *)&v,"angle",(allocator *)&p);
            XML::parm(&sStack_218,pXVar1,(string *)&v);
            fVar7 = std::__cxx11::stof(&sStack_218,(size_t *)0x0);
            std::__cxx11::string::~string((string *)&sStack_218);
            std::__cxx11::string::~string((string *)&v);
            pXVar1 = xml->ptr;
            std::__cxx11::string::string((string *)&sStack_218,"axis",(allocator *)&p);
            XML::parm(&local_80,pXVar1,&sStack_218);
            string_to_Vec3f((embree *)&v,&local_80);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&sStack_218);
            pXVar1 = xml->ptr;
            std::__cxx11::string::string((string *)&sStack_218,"point",(allocator *)&local_158);
            XML::parm(&local_a0,pXVar1,&sStack_218);
            string_to_Vec3f((embree *)&p,&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&sStack_218);
            uStack_1b0 = 0;
            local_1b8 = (undefined1  [8])p.field_0._4_8_;
            local_1a8 = ZEXT416((uint)p.field_0.field_0.x);
            fVar8 = v.field_0.field_0.y * v.field_0.field_0.y;
            fVar16 = v.field_0.field_0.z * v.field_0.field_0.z;
            fVar17 = fVar8 + v.field_0.field_0.x * v.field_0.field_0.x + fVar16;
            auVar20._0_8_ = CONCAT44(fVar8 + fVar8 + 0.0,fVar17);
            auVar20._8_4_ = fVar8 + fVar16 + fVar16;
            auVar20._12_4_ = fVar8 + 0.0 + 0.0;
            auVar26._8_4_ = auVar20._8_4_;
            auVar26._0_8_ = auVar20._0_8_;
            auVar26._12_4_ = auVar20._12_4_;
            auVar11 = rsqrtss(auVar26,auVar20);
            fVar8 = auVar11._0_4_;
            fStack_12c = fVar8 * fVar8 * fVar17 * -0.5 * fVar8 + fVar8 * 1.5;
            local_138 = fStack_12c * v.field_0.field_0.x;
            fStack_134 = fStack_12c * v.field_0.field_0.y;
            fStack_130 = fStack_12c * v.field_0.field_0.z;
            fStack_12c = fStack_12c * 0.0;
            fVar8 = sinf(fVar7 * 0.017453292);
            fVar7 = cosf(fVar7 * 0.017453292);
            fVar16 = (1.0 - local_138 * local_138) * fVar7 + local_138 * local_138;
            fVar28 = 1.0 - fVar7;
            fVar31 = local_138 * fStack_134 * fVar28;
            fVar18 = fVar31 - fVar8 * fStack_130;
            fVar31 = fVar8 * fStack_130 + fVar31;
            fVar32 = (1.0 - fStack_134 * fStack_134) * fVar7 + fStack_134 * fStack_134;
            fVar34 = local_138 * fStack_130 * fVar28;
            fVar28 = fStack_134 * fStack_130 * fVar28;
            fVar29 = fVar34 + fVar8 * fStack_134;
            fVar34 = fVar34 - fVar8 * fStack_134;
            fVar33 = fVar28 - local_138 * fVar8;
            fVar28 = local_138 * fVar8 + fVar28;
            fVar24 = (1.0 - fStack_130 * fStack_130) * fVar7 + fStack_130 * fStack_130;
            fVar7 = fVar16 * 1.0 + fVar31 * 0.0 + fVar34 * 0.0;
            fVar8 = fVar16 * 0.0 + fVar31 * 1.0 + fVar34 * 0.0;
            fVar17 = fVar16 * 0.0 + fVar31 * 0.0 + fVar34 * 1.0;
            fVar16 = fVar16 * 0.0 + fVar31 * 0.0 + fVar34 * 0.0;
            fVar31 = fVar18 * 1.0 + fVar32 * 0.0 + fVar28 * 0.0;
            fVar34 = fVar18 * 0.0 + fVar32 * 1.0 + fVar28 * 0.0;
            fVar23 = fVar18 * 0.0 + fVar32 * 0.0 + fVar28 * 1.0;
            fVar18 = fVar18 * 0.0 + fVar32 * 0.0 + fVar28 * 0.0;
            fVar28 = fVar29 * 1.0 + fVar33 * 0.0 + fVar24 * 0.0;
            fVar32 = fVar29 * 0.0 + fVar33 * 1.0 + fVar24 * 0.0;
            fVar30 = fVar29 * 0.0 + fVar33 * 0.0 + fVar24 * 1.0;
            fVar24 = fVar29 * 0.0 + fVar33 * 0.0 + fVar24 * 0.0;
            (__return_storage_ptr__->l).vx.field_0.m128[0] = fVar31 * 0.0 + fVar28 * 0.0 + fVar7;
            (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar34 * 0.0 + fVar32 * 0.0 + fVar8;
            (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar23 * 0.0 + fVar30 * 0.0 + fVar17;
            (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar18 * 0.0 + fVar24 * 0.0 + fVar16;
            (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar28 * 0.0 + fVar31 + fVar7 * 0.0;
            (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar32 * 0.0 + fVar34 + fVar8 * 0.0;
            (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar30 * 0.0 + fVar23 + fVar17 * 0.0;
            (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar24 * 0.0 + fVar18 + fVar16 * 0.0;
            (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar7 * 0.0 + fVar28 + fVar31 * 0.0;
            (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar8 * 0.0 + fVar32 + fVar34 * 0.0;
            (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar17 * 0.0 + fVar30 + fVar23 * 0.0;
            (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar16 * 0.0 + fVar24 + fVar18 * 0.0;
            (__return_storage_ptr__->p).field_0.m128[0] =
                 ((-(float)local_1b8._0_4_ * fVar31 - (float)local_1b8._4_4_ * fVar28) -
                 (float)local_1a8._0_4_ * fVar7) + p.field_0.field_0.x + 0.0;
            (__return_storage_ptr__->p).field_0.m128[1] =
                 ((-(float)local_1b8._0_4_ * fVar34 - (float)local_1b8._4_4_ * fVar32) -
                 (float)local_1a8._0_4_ * fVar8) + (float)p.field_0._4_8_ + 0.0;
            (__return_storage_ptr__->p).field_0.m128[2] =
                 ((-(float)local_1b8._0_4_ * fVar23 - (float)local_1b8._4_4_ * fVar30) -
                 (float)local_1a8._0_4_ * fVar17) + (float)((ulong)p.field_0._4_8_ >> 0x20) + 0.0;
            (__return_storage_ptr__->p).field_0.m128[3] =
                 ((-(float)local_1b8._0_4_ * fVar18 - (float)local_1b8._4_4_ * fVar24) -
                 (float)local_1a8._0_4_ * fVar16) + 0.0;
            return __return_storage_ptr__;
          }
        }
        else {
LAB_0016aaf0:
          std::__cxx11::string::~string((string *)&sStack_218);
          std::__cxx11::string::~string((string *)&v);
        }
        pXVar1 = xml->ptr;
        std::__cxx11::string::string((string *)&v,"angle",(allocator *)&local_108);
        XML::parm(&sStack_218,pXVar1,(string *)&v);
        bVar6 = std::operator!=(&sStack_218,"");
        if (!bVar6) {
          std::__cxx11::string::~string((string *)&sStack_218);
          std::__cxx11::string::~string((string *)&v);
LAB_0016ae55:
          this_00 = (xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((long)(xml->ptr->body).
                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)this_00 == 0x360) {
            fVar8 = Token::Float(this_00,true);
            local_1a8._0_4_ =
                 Token::Float((xml->ptr->body).
                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1,true);
            local_1a8._4_4_ = extraout_XMM0_Db_01;
            local_1a8._8_4_ = extraout_XMM0_Dc_01;
            local_1a8._12_4_ = extraout_XMM0_Dd_01;
            local_1b8._0_4_ =
                 Token::Float((xml->ptr->body).
                              super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                              _M_impl.super__Vector_impl_data._M_start + 2,true);
            local_1b8._4_4_ = extraout_XMM0_Db_02;
            uStack_1b0._0_4_ = (float)extraout_XMM0_Dc_02;
            uStack_1b0._4_4_ = extraout_XMM0_Dd_02;
            fVar16 = Token::Float((xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4,true);
            fVar17 = Token::Float((xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 5,true);
            local_138 = Token::Float((xml->ptr->body).
                                     super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 6,true);
            local_d8 = Token::Float((xml->ptr->body).
                                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 8,true);
            local_e8 = Token::Float((xml->ptr->body).
                                    super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 9,true);
            fVar18 = Token::Float((xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 10,true);
            fVar7 = local_d8;
            local_1a8._4_4_ = fVar17;
            local_1a8._8_4_ = local_e8;
            local_1a8._12_4_ = 0;
            local_1b8._4_4_ = local_138;
            uStack_1b0._0_4_ = fVar18;
            uStack_1b0._4_4_ = 0;
            fVar17 = Token::Float((xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 3,true);
            fVar18 = Token::Float((xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 7,true);
            fVar31 = Token::Float((xml->ptr->body).
                                  super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 0xb,true);
            aVar22.m128[1] = fVar18;
            aVar22.m128[0] = fVar17;
            aVar22.m128[2] = fVar31;
            aVar22.m128[3] = 0.0;
            uStack_1d0 = (ulong)(uint)fVar7;
            *(ulong *)&(__return_storage_ptr__->l).vx.field_0 = CONCAT44(fVar16,fVar8);
            *(ulong *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uStack_1d0;
            *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = local_1a8._0_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = local_1a8._8_8_;
            *(undefined1 (*) [8])&(__return_storage_ptr__->l).vz.field_0 = local_1b8;
            *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uStack_1b0;
            (__return_storage_ptr__->p).field_0 = aVar22;
            return __return_storage_ptr__;
          }
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_((string *)&v,&xml->ptr->loc);
          std::operator+(&sStack_218,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                         ": wrong AffineSpace body");
          std::runtime_error::runtime_error(this_01,(string *)&sStack_218);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pXVar1 = xml->ptr;
        std::__cxx11::string::string((string *)&local_158,"axis",(allocator *)&local_128);
        XML::parm((string *)&p,pXVar1,&local_158);
        bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&p,"");
        std::__cxx11::string::~string((string *)&p);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&sStack_218);
        std::__cxx11::string::~string((string *)&v);
        if (!bVar6) goto LAB_0016ae55;
        pXVar1 = xml->ptr;
        std::__cxx11::string::string((string *)&v,"angle",(allocator *)&p);
        XML::parm(&sStack_218,pXVar1,(string *)&v);
        fVar7 = std::__cxx11::stof(&sStack_218,(size_t *)0x0);
        std::__cxx11::string::~string((string *)&sStack_218);
        std::__cxx11::string::~string((string *)&v);
        pXVar1 = xml->ptr;
        std::__cxx11::string::string((string *)&sStack_218,"axis",(allocator *)&p);
        XML::parm(&local_c0,pXVar1,&sStack_218);
        string_to_Vec3f((embree *)&v,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&sStack_218);
        fVar8 = v.field_0.field_0.y * v.field_0.field_0.y;
        fVar16 = v.field_0.field_0.z * v.field_0.field_0.z;
        fVar17 = fVar8 + v.field_0.field_0.x * v.field_0.field_0.x + fVar16;
        auVar21._0_8_ = CONCAT44(fVar8 + fVar8 + 0.0,fVar17);
        auVar21._8_4_ = fVar8 + fVar16 + fVar16;
        auVar21._12_4_ = fVar8 + 0.0 + 0.0;
        auVar27._8_4_ = auVar21._8_4_;
        auVar27._0_8_ = auVar21._0_8_;
        auVar27._12_4_ = auVar21._12_4_;
        auVar11 = rsqrtss(auVar27,auVar21);
        fVar8 = auVar11._0_4_;
        fVar8 = fVar8 * fVar8 * fVar17 * -0.5 * fVar8 + fVar8 * 1.5;
        local_1b8._4_4_ = fVar8 * v.field_0.field_0.y;
        local_1b8._0_4_ = fVar8 * v.field_0.field_0.x;
        uStack_1b0._0_4_ = fVar8 * v.field_0.field_0.z;
        uStack_1b0._4_4_ = fVar8 * 0.0;
        local_1a8._0_4_ = sinf(fVar7 * 0.017453292);
        local_1a8._4_4_ = extraout_XMM0_Db_00;
        local_1a8._8_4_ = extraout_XMM0_Dc_00;
        local_1a8._12_4_ = extraout_XMM0_Dd_00;
        fVar7 = cosf(fVar7 * 0.017453292);
        aVar15._0_4_ = (1.0 - (float)local_1b8._0_4_ * (float)local_1b8._0_4_) * fVar7 +
                       (float)local_1b8._0_4_ * (float)local_1b8._0_4_;
        fVar8 = 1.0 - fVar7;
        aVar15.m128[1] =
             (float)local_1b8._0_4_ * (float)local_1b8._4_4_ * fVar8 +
             (float)local_1a8._0_4_ * (float)uStack_1b0;
        aVar15.m128[2] =
             (float)uStack_1b0 * (float)local_1b8._0_4_ * fVar8 -
             (float)local_1b8._4_4_ * (float)local_1a8._0_4_;
        aVar15.m128[3] = 0.0;
        (__return_storage_ptr__->l).vx.field_0 = aVar15;
        aVar3.m128[1] =
             (float)local_1b8._4_4_ * (float)local_1b8._4_4_ +
             fVar7 * (1.0 - (float)local_1b8._4_4_ * (float)local_1b8._4_4_);
        aVar3.m128[0] =
             fVar8 * (float)local_1b8._0_4_ * (float)local_1b8._4_4_ +
             (float)local_1a8._0_4_ * -(float)uStack_1b0;
        aVar3.m128[2] =
             (float)uStack_1b0 * (float)local_1b8._4_4_ * fVar8 +
             (float)local_1b8._0_4_ * (float)local_1a8._0_4_;
        aVar3.m128[3] = 0.0;
        (__return_storage_ptr__->l).vy.field_0 = aVar3;
        aVar5.m128[1] =
             fVar8 * (float)uStack_1b0 * (float)local_1b8._4_4_ +
             -(float)local_1b8._0_4_ * (float)local_1a8._0_4_;
        aVar5.m128[0] =
             fVar8 * (float)uStack_1b0 * (float)local_1b8._0_4_ +
             (float)local_1b8._4_4_ * (float)local_1a8._0_4_;
        aVar5.m128[2] =
             (1.0 - (float)uStack_1b0 * (float)uStack_1b0) * fVar7 +
             (float)uStack_1b0 * (float)uStack_1b0;
        aVar5.m128[3] = 0.0;
        (__return_storage_ptr__->l).vz.field_0 = aVar5;
        goto code_r0x0016a5ea;
      }
      pXVar1 = xml->ptr;
      std::__cxx11::string::string((string *)&v,"rotate_z",(allocator *)&p);
      XML::parm(&sStack_218,pXVar1,(string *)&v);
      fVar7 = std::__cxx11::stof(&sStack_218,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&sStack_218);
      std::__cxx11::string::~string((string *)&v);
      auVar19._0_12_ = ZEXT812(0x3f800000);
      auVar19._12_4_ = 0;
      auVar11 = rsqrtss(auVar19,auVar19);
      fVar8 = auVar11._0_4_;
      fVar8 = fVar8 * fVar8 * fVar8 * -0.5 + fVar8 * 1.5;
      local_1b8._4_4_ = fVar8 * 0.0;
      uStack_1b0._0_4_ = fVar8 * 1.0;
    }
    local_1b8._0_4_ = fVar8 * 0.0;
    uStack_1b0._4_4_ = fVar8 * 0.0;
  }
  local_1a8._0_4_ = sinf(fVar7 * 0.017453292);
  local_1a8._4_4_ = extraout_XMM0_Db;
  local_1a8._8_4_ = extraout_XMM0_Dc;
  local_1a8._12_4_ = extraout_XMM0_Dd;
  fVar7 = cosf(fVar7 * 0.017453292);
  aVar14._0_4_ = (1.0 - (float)local_1b8._0_4_ * (float)local_1b8._0_4_) * fVar7 +
                 (float)local_1b8._0_4_ * (float)local_1b8._0_4_;
  fVar8 = 1.0 - fVar7;
  aVar14.m128[1] =
       (float)local_1b8._0_4_ * (float)local_1b8._4_4_ * fVar8 +
       (float)local_1a8._0_4_ * (float)uStack_1b0;
  aVar14.m128[2] =
       (float)uStack_1b0 * (float)local_1b8._0_4_ * fVar8 -
       (float)local_1b8._4_4_ * (float)local_1a8._0_4_;
  aVar14.m128[3] = 0.0;
  (__return_storage_ptr__->l).vx.field_0 = aVar14;
  aVar2.m128[1] =
       (float)local_1b8._4_4_ * (float)local_1b8._4_4_ +
       fVar7 * (1.0 - (float)local_1b8._4_4_ * (float)local_1b8._4_4_);
  aVar2.m128[0] =
       fVar8 * (float)local_1b8._0_4_ * (float)local_1b8._4_4_ +
       (float)local_1a8._0_4_ * -(float)uStack_1b0;
  aVar2.m128[2] =
       (float)uStack_1b0 * (float)local_1b8._4_4_ * fVar8 +
       (float)local_1b8._0_4_ * (float)local_1a8._0_4_;
  aVar2.m128[3] = 0.0;
  (__return_storage_ptr__->l).vy.field_0 = aVar2;
  aVar4.m128[1] =
       fVar8 * (float)uStack_1b0 * (float)local_1b8._4_4_ +
       -(float)local_1b8._0_4_ * (float)local_1a8._0_4_;
  aVar4.m128[0] =
       fVar8 * (float)uStack_1b0 * (float)local_1b8._0_4_ +
       (float)local_1b8._4_4_ * (float)local_1a8._0_4_;
  aVar4.m128[2] =
       (1.0 - (float)uStack_1b0 * (float)uStack_1b0) * fVar7 + (float)uStack_1b0 * (float)uStack_1b0
  ;
  aVar4.m128[3] = 0.0;
  (__return_storage_ptr__->l).vz.field_0 = aVar4;
code_r0x0016a5ea:
  aVar12._0_12_ = ZEXT812(0);
  aVar12.m128[3] = 0.0;
  (__return_storage_ptr__->p).field_0 = aVar12;
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3fa XMLLoader::load<AffineSpace3fa>(const Ref<XML>& xml) 
  {
    if (xml->parm("translate") != "") {
      const Vec3f v = string_to_Vec3f(xml->parm("translate"));
      return AffineSpace3fa::translate(v);
    } else if (xml->parm("scale") != "") {
      const Vec3f v = string_to_Vec3f(xml->parm("scale"));
      return AffineSpace3fa::scale(v);
    } else if (xml->parm("rotate_x") != "") {
      const float degrees = std::stof(xml->parm("rotate_x"));
      return AffineSpace3fa::rotate(Vec3f(1,0,0),deg2rad(degrees));
    } else if (xml->parm("rotate_y") != "") {
      const float degrees = std::stof(xml->parm("rotate_y"));
      return AffineSpace3fa::rotate(Vec3f(0,1,0),deg2rad(degrees));
    } else if (xml->parm("rotate_z") != "") {
      const float degrees = std::stof(xml->parm("rotate_z"));
      return AffineSpace3fa::rotate(Vec3f(0,0,1),deg2rad(degrees));
    } else if (xml->parm("angle") != "" && xml->parm("axis") != "" && xml->parm("point") != "") {
      const float degrees = std::stof(xml->parm("angle"));
      const Vec3f v = string_to_Vec3f(xml->parm("axis"));
      const Vec3f p = string_to_Vec3f(xml->parm("point"));
      return AffineSpace3fa::rotate(p,v,deg2rad(degrees));
    } else if (xml->parm("angle") != "" && xml->parm("axis") != "") {
      const float degrees = std::stof(xml->parm("angle"));
      const Vec3f v = string_to_Vec3f(xml->parm("axis"));
      return AffineSpace3fa::rotate(v,deg2rad(degrees));
    } else {
      if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
      return AffineSpace3fa(LinearSpace3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[ 2].Float(),
                                           xml->body[4].Float(),xml->body[5].Float(),xml->body[ 6].Float(),
                                           xml->body[8].Float(),xml->body[9].Float(),xml->body[10].Float()),
                            Vec3fa(xml->body[3].Float(),xml->body[7].Float(),xml->body[11].Float()));
    }
  }